

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error parse_dict(T1_Face face,T1_Loader loader,FT_Byte *base,FT_ULong size)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  FT_UInt FVar5;
  size_t sVar6;
  T1_Face *ppTVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *__s2;
  long lVar10;
  T1_Face pTVar11;
  T1_Face pTVar12;
  byte *pbVar13;
  T1_FieldRec *pTVar14;
  bool bVar15;
  T1_Face local_80;
  byte local_71;
  T1_Face local_70;
  T1_Face local_68;
  byte *local_60;
  T1_Face local_58;
  ulong local_50;
  T1_Face local_48;
  T1_Face local_40;
  FT_Byte *local_38;
  
  (loader->parser).root.cursor = base;
  pbVar8 = base + size;
  (loader->parser).root.limit = pbVar8;
  (loader->parser).root.error = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar13 = (loader->parser).root.cursor;
  if (pbVar8 <= pbVar13) {
LAB_0026002f:
    return (loader->parser).root.error;
  }
  pTVar11 = (T1_Face)&(face->type1).font_bbox;
  local_40 = (T1_Face)&(face->type1).private_dict;
  local_48 = (T1_Face)&(face->type1).font_extra;
  local_58 = (T1_Face)&face->type1;
  local_60 = (byte *)0x0;
  bVar2 = 0;
LAB_0025fbc7:
  bVar1 = *pbVar13;
  if (bVar1 != 0x46) {
    if (bVar1 == 99) {
      if (pbVar13 + 10 != pbVar8) {
        if (pbVar13 + 10 < pbVar8) {
          bVar2 = pbVar13[9];
          if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
             || ((bVar2 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)
                 ))) goto LAB_0025fc8c;
        }
        goto LAB_0025feab;
      }
LAB_0025fc8c:
      sVar6 = 9;
      __s2 = "closefile";
LAB_0025fc9b:
      iVar3 = strncmp((char *)pbVar13,__s2,sVar6);
      if (iVar3 != 0) goto LAB_0025feab;
      goto LAB_0026002f;
    }
    if (bVar1 == 0x65) {
      if (pbVar13 + 6 != pbVar8) {
        if (pbVar13 + 6 < pbVar8) {
          bVar2 = pbVar13[5];
          if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
             || ((bVar2 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)
                 ))) goto LAB_0025fc2f;
        }
        goto LAB_0025feab;
      }
LAB_0025fc2f:
      sVar6 = 5;
      __s2 = "eexec";
      goto LAB_0025fc9b;
    }
    if (bVar1 - 0x30 < 10) {
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      bVar2 = 1;
      local_60 = pbVar13;
      if ((loader->parser).root.error == 0) goto LAB_0025fec0;
      goto LAB_0026002f;
    }
    if (pbVar13 + 6 < pbVar8 && bVar1 == 0x52) {
      bVar15 = pbVar13[1] == 0x44;
LAB_0025fd99:
      if (!(bool)(bVar2 & bVar15)) goto LAB_0025feab;
      (loader->parser).root.cursor = local_60;
      iVar3 = read_binary_data(&loader->parser,(FT_ULong *)&local_80,&local_38,
                               ((face->root).internal)->incremental_interface !=
                               (FT_Incremental_InterfaceRec *)0x0);
      if (iVar3 == 0) {
        return 3;
      }
    }
    else {
      if (bVar1 == 0x2d && pbVar13 + 6 < pbVar8) {
        bVar15 = pbVar13[1] == 0x7c;
        goto LAB_0025fd99;
      }
      if (pbVar8 <= pbVar13 + 2 || bVar1 != 0x2f) goto LAB_0025feab;
      pbVar13 = pbVar13 + 1;
      (loader->parser).root.cursor = pbVar13;
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      if ((loader->parser).root.error != 0) goto LAB_0026002f;
      pbVar9 = (loader->parser).root.cursor;
      uVar4 = (long)pbVar9 - (long)pbVar13;
      if (pbVar9 < pbVar8 && (int)uVar4 - 1U < 0x15) {
        local_71 = *pbVar13;
        local_50 = uVar4 & 0xffffffff;
        pbVar9 = (byte *)0x3360b5;
        pTVar14 = t1_keywords;
        local_70 = pTVar11;
        local_68 = face;
LAB_0025fe63:
        if (((local_71 != *pbVar9) || (sVar6 = strlen((char *)pbVar9), local_50 != sVar6)) ||
           (iVar3 = bcmp(pbVar13,pbVar9,local_50), iVar3 != 0)) goto LAB_0025fe8f;
        if (((pTVar14->dict & (loader->keywords_encountered & 1) + 1) == 0) ||
           (((loader->keywords_encountered & 2) != 0 &&
            (iVar3 = strcmp((char *)pbVar9,"CharStrings"), iVar3 != 0)))) goto LAB_0025fea4;
        face = local_68;
        pTVar11 = (T1_Face)local_68->blend;
        if (pTVar11 == (T1_Face)0x0) {
          pTVar12 = (T1_Face)0x0;
        }
        else {
          pTVar12 = (T1_Face)0x0;
          if (*(int *)&((PS_ParserRec *)&(pTVar11->root).num_faces)->cursor != 0) {
            pTVar12 = pTVar11;
          }
        }
        if (pTVar14->type == T1_FIELD_TYPE_CALLBACK) {
          (*pTVar14->reader)(&local_68->root,loader);
          iVar3 = (loader->parser).root.error;
          goto LAB_0025fffd;
        }
        local_80 = local_58;
        switch(pTVar14->location) {
        case T1_FIELD_LOCATION_FONT_EXTRA:
          local_80 = local_48;
          break;
        case T1_FIELD_LOCATION_FONT_INFO:
          lVar10 = 0x118;
          goto LAB_0025ffac;
        case T1_FIELD_LOCATION_PRIVATE:
          local_80 = local_40;
          lVar10 = 0x1a0;
          goto LAB_0025ffac;
        case T1_FIELD_LOCATION_BBOX:
          local_80 = local_70;
          lVar10 = 0x230;
LAB_0025ffac:
          if (pTVar12 == (T1_Face)0x0) break;
          ppTVar7 = (T1_Face *)
                    ((long)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor + lVar10);
          FVar5 = *(FT_UInt *)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor;
          pTVar11 = *(T1_Face *)
                     ((long)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor + lVar10);
LAB_0025ffd7:
          if (pTVar11 != (T1_Face)0x0) goto LAB_0025ffdc;
          (loader->parser).root.error = 0;
          goto LAB_0025fea4;
        case T1_FIELD_LOCATION_LOADER:
          local_80 = (T1_Face)loader;
          break;
        case T1_FIELD_LOCATION_FACE:
          local_80 = local_68;
          break;
        case T1_FIELD_LOCATION_BLEND:
          FVar5 = 0;
          ppTVar7 = &local_80;
          local_80 = pTVar11;
          goto LAB_0025ffd7;
        }
        FVar5 = 0;
        ppTVar7 = &local_80;
LAB_0025ffdc:
        if (pTVar14->type - T1_FIELD_TYPE_INTEGER_ARRAY < 2) {
          iVar3 = (*(loader->parser).root.funcs.load_field_table)
                            ((PS_Parser)loader,pTVar14,ppTVar7,FVar5,(FT_ULong *)0x0);
        }
        else {
          iVar3 = (*(loader->parser).root.funcs.load_field)
                            ((PS_Parser)loader,pTVar14,ppTVar7,FVar5,(FT_ULong *)0x0);
        }
LAB_0025fffd:
        (loader->parser).root.error = iVar3;
        pTVar11 = local_70;
        if (iVar3 != 0) {
          if ((char)iVar3 != -0x5e) {
            return iVar3;
          }
          (loader->parser).root.error = 0;
        }
      }
    }
LAB_0025febd:
    bVar2 = 0;
    goto LAB_0025fec0;
  }
  if (pbVar13 + 0xe != pbVar8) {
    if (pbVar13 + 0xe < pbVar8) {
      bVar1 = pbVar13[0xd];
      if ((((ulong)bVar1 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         ((bVar1 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
      goto LAB_0025fcf9;
    }
LAB_0025feab:
    (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
    if ((loader->parser).root.error == 0) goto LAB_0025febd;
    goto LAB_0026002f;
  }
LAB_0025fcf9:
  iVar3 = strncmp((char *)pbVar13,"FontDirectory",0xd);
  if (iVar3 != 0) goto LAB_0025feab;
  if ((loader->keywords_encountered & 1) != 0) {
    loader->keywords_encountered = loader->keywords_encountered | 2;
  }
  (loader->parser).root.cursor = pbVar13 + 0xd;
LAB_0025fec0:
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar13 = (loader->parser).root.cursor;
  if (pbVar8 <= pbVar13) goto LAB_0026002f;
  goto LAB_0025fbc7;
LAB_0025fe8f:
  pbVar9 = (byte *)pTVar14[1].ident;
  pTVar14 = pTVar14 + 1;
  if (pbVar9 == (byte *)0x0) goto LAB_0025fea4;
  goto LAB_0025fe63;
LAB_0025fea4:
  bVar2 = 0;
  face = local_68;
  pTVar11 = local_70;
  goto LAB_0025fec0;
}

Assistant:

static FT_Error
  parse_dict( T1_Face    face,
              T1_Loader  loader,
              FT_Byte*   base,
              FT_ULong   size )
  {
    T1_Parser  parser = &loader->parser;
    FT_Byte   *limit, *start_binary = NULL;
    FT_Bool    have_integer = 0;


    parser->root.cursor = base;
    parser->root.limit  = base + size;
    parser->root.error  = FT_Err_Ok;

    limit = parser->root.limit;

    T1_Skip_Spaces( parser );

    while ( parser->root.cursor < limit )
    {
      FT_Byte*  cur;


      cur = parser->root.cursor;

      /* look for `eexec' */
      if ( IS_PS_TOKEN( cur, limit, "eexec" ) )
        break;

      /* look for `closefile' which ends the eexec section */
      else if ( IS_PS_TOKEN( cur, limit, "closefile" ) )
        break;

      /* in a synthetic font the base font starts after a           */
      /* `FontDictionary' token that is placed after a Private dict */
      else if ( IS_PS_TOKEN( cur, limit, "FontDirectory" ) )
      {
        if ( loader->keywords_encountered & T1_PRIVATE )
          loader->keywords_encountered |=
            T1_FONTDIR_AFTER_PRIVATE;
        parser->root.cursor += 13;
      }

      /* check whether we have an integer */
      else if ( ft_isdigit( *cur ) )
      {
        start_binary = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 1;
      }

      /* in valid Type 1 fonts we don't see `RD' or `-|' directly */
      /* since those tokens are handled by parse_subrs and        */
      /* parse_charstrings                                        */
      else if ( *cur == 'R' && cur + 6 < limit && *( cur + 1 ) == 'D' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      else if ( *cur == '-' && cur + 6 < limit && *( cur + 1 ) == '|' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      /* look for immediates */
      else if ( *cur == '/' && cur + 2 < limit )
      {
        FT_UInt  len;


        cur++;

        parser->root.cursor = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        len = (FT_UInt)( parser->root.cursor - cur );

        if ( len > 0 && len < 22 && parser->root.cursor < limit )
        {
          /* now compare the immediate name to the keyword table */
          T1_Field  keyword = (T1_Field)t1_keywords;


          for (;;)
          {
            FT_Byte*  name;


            name = (FT_Byte*)keyword->ident;
            if ( !name )
              break;

            if ( cur[0] == name[0]                      &&
                 len == ft_strlen( (const char *)name ) &&
                 ft_memcmp( cur, name, len ) == 0       )
            {
              /* We found it -- run the parsing callback!     */
              /* We record every instance of every field      */
              /* (until we reach the base font of a           */
              /* synthetic font) to deal adequately with      */
              /* multiple master fonts; this is also          */
              /* necessary because later PostScript           */
              /* definitions override earlier ones.           */

              /* Once we encounter `FontDirectory' after      */
              /* `/Private', we know that this is a synthetic */
              /* font; except for `/CharStrings' we are not   */
              /* interested in anything that follows this     */
              /* `FontDirectory'.                             */

              /* MM fonts have more than one /Private token at */
              /* the top level; let's hope that all the junk   */
              /* that follows the first /Private token is not  */
              /* interesting to us.                            */

              /* According to Adobe Tech Note #5175 (CID-Keyed */
              /* Font Installation for ATM Software) a `begin' */
              /* must be followed by exactly one `end', and    */
              /* `begin' -- `end' pairs must be accurately     */
              /* paired.  We could use this to distinguish     */
              /* between the global Private and the Private    */
              /* dict that is a member of the Blend dict.      */

              const FT_UInt dict =
                ( loader->keywords_encountered & T1_PRIVATE )
                    ? T1_FIELD_DICT_PRIVATE
                    : T1_FIELD_DICT_FONTDICT;


              if ( !( dict & keyword->dict ) )
              {
                FT_TRACE1(( "parse_dict: found `%s' but ignoring it"
                            " since it is in the wrong dictionary\n",
                            keyword->ident ));
                break;
              }

              if ( !( loader->keywords_encountered &
                      T1_FONTDIR_AFTER_PRIVATE     )                  ||
                   ft_strcmp( (const char*)name, "CharStrings" ) == 0 )
              {
                parser->root.error = t1_load_keyword( face,
                                                      loader,
                                                      keyword );
                if ( parser->root.error )
                {
                  if ( FT_ERR_EQ( parser->root.error, Ignore ) )
                    parser->root.error = FT_Err_Ok;
                  else
                    return parser->root.error;
                }
              }
              break;
            }

            keyword++;
          }
        }

        have_integer = 0;
      }
      else
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 0;
      }

      T1_Skip_Spaces( parser );
    }

  Exit:
    return parser->root.error;
  }